

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

string_view __thiscall choc::value::ValueView::getString(ValueView *this)

{
  StringDictionary *pSVar1;
  Handle HVar2;
  string_view sVar3;
  undefined4 extraout_var;
  char *extraout_RDX;
  
  pSVar1 = this->stringDictionary;
  if (pSVar1 != (StringDictionary *)0x0) {
    HVar2 = getStringHandle(this);
    sVar3._M_len._0_4_ = (*pSVar1->_vptr_StringDictionary[3])(pSVar1,(ulong)HVar2.handle);
    sVar3._M_len._4_4_ = extraout_var;
    sVar3._M_str = extraout_RDX;
    return sVar3;
  }
  throwError("No string dictionary supplied");
}

Assistant:

inline std::string_view ValueView::getString() const
{
    check (stringDictionary != nullptr, "No string dictionary supplied");
    return stringDictionary->getStringForHandle (getStringHandle());
}